

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_math.cpp
# Opt level: O2

SW_FT_Angle SW_FT_Atan2(SW_FT_Fixed dx,SW_FT_Fixed dy)

{
  SW_FT_Vector v;
  SW_FT_Vector local_18;
  
  if (dy != 0 || dx != 0) {
    local_18.x = dx;
    local_18.y = dy;
    ft_trig_prenorm(&local_18);
    ft_trig_pseudo_polarize(&local_18);
    return local_18.y;
  }
  return 0;
}

Assistant:

SW_FT_Angle SW_FT_Atan2(SW_FT_Fixed dx, SW_FT_Fixed dy)
{
    SW_FT_Vector v;

    if (dx == 0 && dy == 0) return 0;

    v.x = dx;
    v.y = dy;
    ft_trig_prenorm(&v);
    ft_trig_pseudo_polarize(&v);

    return v.y;
}